

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

pair<unsigned_long,_chaiscript::Boxed_Value> * __thiscall
chaiscript::detail::Dispatch_Engine::get_function_object_int
          (pair<unsigned_long,_chaiscript::Boxed_Value> *__return_storage_ptr__,
          Dispatch_Engine *this,string_view t_name,size_t t_hint)

{
  undefined8 uVar1;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  _Var2;
  range_error *this_00;
  allocator<char> local_69;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  string_view t_name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  t_name_local._M_str = t_name._M_str;
  t_name_local._M_len = t_name._M_len;
  _Var2 = utility::QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
          ::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
                      *)&(this->m_state).m_boxed_functions,&t_name_local,t_hint);
  if (_Var2._M_current !=
      (this->m_state).m_boxed_functions.data.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_68._0_8_ =
         ((long)_Var2._M_current -
         (long)(this->m_state).m_boxed_functions.data.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (local_68 + 8),
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               &(_Var2._M_current)->second);
    uVar1 = aStack_58._M_allocated_capacity;
    __return_storage_ptr__->first = local_68._0_8_;
    aStack_58._M_allocated_capacity = 0;
    (__return_storage_ptr__->second).m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68._8_8_;
    (__return_storage_ptr__->second).m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
    local_68._8_8_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_58._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&t_name_local,&local_69);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 "Object not found: ",&local_38);
  std::range_error::range_error(this_00,(string *)local_68);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::pair<size_t, Boxed_Value> get_function_object_int(std::string_view t_name, const size_t t_hint) const {
        const auto &funs = get_boxed_functions_int();

        if (const auto itr = funs.find(t_name, t_hint); itr != funs.end()) {
          return std::make_pair(std::distance(funs.begin(), itr), itr->second);
        } else {
          throw std::range_error("Object not found: " + std::string(t_name));
        }
      }